

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

TValue * lj_tab_setstr(lua_State *L,GCtab *t,GCstr *key)

{
  TValue *pTVar1;
  TValue k;
  cTValue local_8;
  
  pTVar1 = (TValue *)((ulong)(t->node).ptr32 + (ulong)(t->hmask & key->hash) * 0x18);
  while ((*(int *)((long)pTVar1 + 0xc) != -5 || ((GCstr *)(ulong)pTVar1[1].u32.lo != key))) {
    pTVar1 = (TValue *)(ulong)pTVar1[2].u32.lo;
    if (pTVar1 == (TValue *)0x0) {
      local_8.field_2.it = 0xfffffffb;
      local_8.u32.lo = (int)key;
      pTVar1 = lj_tab_newkey(L,t,&local_8);
      return pTVar1;
    }
  }
  return pTVar1;
}

Assistant:

TValue *lj_tab_setstr(lua_State *L, GCtab *t, GCstr *key)
{
  TValue k;
  Node *n = hashstr(t, key);
  do {
    if (tvisstr(&n->key) && strV(&n->key) == key)
      return &n->val;
  } while ((n = nextnode(n)));
  setstrV(L, &k, key);
  return lj_tab_newkey(L, t, &k);
}